

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

int Lf_ObjArrival_rec(Lf_Man_t *p,Gia_Obj_t *pDriver)

{
  int iVar1;
  Lf_Bst_t *pLVar2;
  uint uVar3;
  
  while( true ) {
    iVar1 = Gia_ObjIsBuf(pDriver);
    uVar3 = (uint)*(undefined8 *)pDriver;
    if (iVar1 == 0) break;
    pDriver = pDriver + -(ulong)(uVar3 & 0x1fffffff);
  }
  if ((~uVar3 & 0x1fffffff) == 0 || (int)uVar3 < 0) {
    iVar1 = 0;
    if ((~uVar3 & 0x9fffffff) == 0) {
      iVar1 = Gia_ObjCioId(pDriver);
      iVar1 = Vec_IntEntry(&p->vCiArrivals,iVar1);
      return iVar1;
    }
  }
  else {
    iVar1 = Gia_ObjId(p->pGia,pDriver);
    pLVar2 = Lf_ObjReadBest(p,iVar1);
    iVar1 = pLVar2->Delay[0];
  }
  return iVar1;
}

Assistant:

int Lf_ObjArrival_rec( Lf_Man_t * p, Gia_Obj_t * pDriver )
{
    if ( Gia_ObjIsBuf(pDriver) )
        return Lf_ObjArrival_rec( p, Gia_ObjFanin0(pDriver) );
    if ( Gia_ObjIsAnd(pDriver) )
        return Lf_ObjReadBest(p, Gia_ObjId(p->pGia, pDriver))->Delay[0];
    if ( Gia_ObjIsCi(pDriver) )
        return Lf_ObjCiArrival(p, Gia_ObjCioId(pDriver));
    return 0;
}